

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

QString * commandLinesForOutput(QStringList *commands)

{
  int iVar1;
  qsizetype qVar2;
  QList<QString> *in_RSI;
  QListSpecialMethods<QString> *in_RDI;
  long in_FS_OFFSET;
  int i;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff48;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  QListSpecialMethods<QString> *this;
  int local_7c;
  QList<QString> *ch;
  undefined1 local_38 [24];
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  ch = in_RSI;
  if ((commandLinesForOutput(QList<QString>)::errchk == '\0') &&
     (iVar1 = __cxa_guard_acquire(&commandLinesForOutput(QList<QString>)::errchk), iVar1 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_20,(Data *)0x0,L"if errorlevel 1 goto VCEnd",0x1a);
    QString::QString((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff50);
    __cxa_atexit(QString::~QString,&commandLinesForOutput::errchk,&__dso_handle);
    __cxa_guard_release(&commandLinesForOutput(QList<QString>)::errchk);
  }
  qVar2 = QList<QString>::size(in_RSI);
  for (local_7c = (int)qVar2 + -2; -1 < local_7c; local_7c = local_7c + -1) {
    in_stack_ffffffffffffff50 =
         &QList<QString>::at((QList<QString> *)in_stack_ffffffffffffff50,
                             (qsizetype)in_stack_ffffffffffffff48)->d;
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     (char *)ch);
    in_stack_ffffffffffffff5f =
         QString::startsWith((QString *)in_stack_ffffffffffffff50,(CaseSensitivity)local_38);
    in_stack_ffffffffffffff5f = in_stack_ffffffffffffff5f ^ 0xff;
    QString::~QString((QString *)0x248987);
    if ((in_stack_ffffffffffffff5f & 1) != 0) {
      QList<QString>::insert
                ((QList<QString> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 (qsizetype)in_stack_ffffffffffffff50,(parameter_type)in_stack_ffffffffffffff48);
    }
  }
  QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                   (char *)ch);
  QListSpecialMethods<QString>::join(this,(QString *)in_RSI);
  QString::~QString((QString *)0x2489f4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

static QString commandLinesForOutput(QStringList commands)
{
    // MSBuild puts the contents of the custom commands into a batch file and calls it.
    // As we want every sub-command to be error-checked (as is done by makefile-based
    // backends), we insert the checks ourselves, using the undocumented jump target.
    static QString errchk = QStringLiteral("if errorlevel 1 goto VCEnd");
    for (int i = commands.size() - 2; i >= 0; --i) {
        if (!commands.at(i).startsWith("rem", Qt::CaseInsensitive))
            commands.insert(i + 1, errchk);
    }
    return commands.join("\r\n");
}